

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

void aom_quantize_b_adaptive_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  uint local_68;
  int local_64 [4];
  int local_54;
  int16_t *local_50;
  int16_t *local_48;
  int16_t *local_40;
  undefined8 local_38;
  
  bVar3 = (byte)log_scale;
  local_64[2] = (1 << (bVar3 & 0x1f)) >> 1;
  local_64[0] = *zbin_ptr + local_64[2] >> (bVar3 & 0x1f);
  local_64[3] = -local_64[0];
  local_64[1] = zbin_ptr[1] + local_64[2] >> (bVar3 & 0x1f);
  local_54 = -local_64[1];
  local_50 = round_ptr;
  local_48 = quant_ptr;
  local_40 = quant_shift_ptr;
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  auVar14 = pshuflw(ZEXT416(*(uint *)dequant_ptr),ZEXT416(*(uint *)dequant_ptr),0xd4);
  auVar14 = pmaddwd(auVar14,_DAT_00515b60);
  local_38 = CONCAT44(auVar14._4_4_ + 0x40 >> 7,auVar14._0_4_ + 0x40 >> 7);
  uVar2 = n_coeffs & 0xffffffff;
  do {
    uVar11 = (uint)n_coeffs;
    if ((int)uVar2 < 1) break;
    sVar1 = scan[uVar2 - 1];
    if (qm_ptr == (qm_val_t *)0x0) {
      uVar5 = 0x20;
    }
    else {
      uVar5 = (uint)qm_ptr[sVar1];
    }
    uVar7 = (ulong)((uint)(sVar1 != 0) * 4);
    iVar9 = *(int *)((long)&local_38 + uVar7);
    if ((int)(uVar5 * coeff_ptr[sVar1]) < *(int *)((long)local_64 + uVar7) * 0x20 + iVar9) {
      bVar13 = local_64[(ulong)(sVar1 != 0) + 3] * 0x20 - iVar9 < (int)(uVar5 * coeff_ptr[sVar1]);
      n_coeffs = (intptr_t)(uVar11 - bVar13);
    }
    else {
      bVar13 = false;
    }
    uVar11 = (uint)n_coeffs;
    uVar2 = uVar2 - 1;
  } while (bVar13);
  if ((int)uVar11 < 1) {
    uVar5 = 0xffffffff;
    local_68 = 0xffffffff;
  }
  else {
    local_68 = 0xffffffff;
    uVar2 = 0;
    uVar5 = 0xffffffff;
    do {
      sVar1 = scan[uVar2];
      iVar9 = coeff_ptr[sVar1];
      iVar8 = -iVar9;
      if (0 < iVar9) {
        iVar8 = iVar9;
      }
      if (qm_ptr == (qm_val_t *)0x0) {
        bVar4 = 0x20;
      }
      else {
        bVar4 = qm_ptr[sVar1];
      }
      bVar13 = sVar1 != 0;
      if (local_64[bVar13] * 0x20 <= (int)(iVar8 * (uint)bVar4)) {
        uVar7 = (ulong)((uint)bVar13 * 2);
        iVar8 = (*(short *)((long)local_50 + uVar7) + local_64[2] >> (bVar3 & 0x1f)) + iVar8;
        if (0x7ffe < iVar8) {
          iVar8 = 0x7fff;
        }
        if (iVar8 < -0x7fff) {
          iVar8 = -0x8000;
        }
        uVar10 = iVar9 >> 0x1f;
        uVar12 = (uint)((long)((long)*(short *)((long)local_40 + uVar7) *
                              (((long)((long)*(short *)((long)local_48 + uVar7) *
                                      (ulong)bVar4 * (long)iVar8) >> 0x10) +
                              (ulong)bVar4 * (long)iVar8)) >> (0x15 - bVar3 & 0x3f));
        qcoeff_ptr[sVar1] = (uVar10 ^ uVar12) - uVar10;
        if (iqm_ptr == (qm_val_t *)0x0) {
          uVar6 = 0x20;
        }
        else {
          uVar6 = (uint)iqm_ptr[sVar1];
        }
        dqcoeff_ptr[sVar1] =
             ((int)(((int)((int)dequant_ptr[bVar13] * uVar6 + 0x10) >> 5) * uVar12) >>
              (bVar3 & 0x1f) ^ uVar10) - uVar10;
        if ((uVar12 != 0) && (local_68 = (uint)uVar2, uVar5 == 0xffffffff)) {
          uVar5 = local_68;
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar11 != uVar2);
  }
  if ((-1 < (int)local_68) && (uVar5 == local_68)) {
    sVar1 = scan[local_68];
    if ((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) {
      if (qm_ptr == (qm_val_t *)0x0) {
        uVar11 = 0x20;
      }
      else {
        uVar11 = (uint)qm_ptr[sVar1];
      }
      uVar2 = (ulong)(sVar1 != 0);
      iVar9 = dequant_ptr[uVar2] * 0x20d + 0x40 >> 7;
      if (((int)(uVar11 * coeff_ptr[sVar1]) < local_64[uVar2] * 0x20 + iVar9) &&
         (local_64[uVar2 + 3] * 0x20 - iVar9 < (int)(uVar11 * coeff_ptr[sVar1]))) {
        qcoeff_ptr[sVar1] = 0;
        dqcoeff_ptr[sVar1] = 0;
        local_68 = 0xffffffff;
      }
    }
  }
  *eob_ptr = (short)local_68 + 1;
  return;
}

Assistant:

void aom_quantize_b_adaptive_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int i, non_zero_count = (int)n_coeffs, eob = -1;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  int prescan_add[2];
  for (i = 0; i < 2; ++i)
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;
    const int prescan_add_val = prescan_add[rc != 0];
    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif  // SKIP_EOB_FACTOR_ADJUST
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32;

    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      int64_t tmp =
          clamp(abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale),
                INT16_MIN, INT16_MAX);
      tmp *= wt;
      tmp32 = (int)(((((tmp * quant_ptr[rc != 0]) >> 16) + tmp) *
                     quant_shift_ptr[rc != 0]) >>
                    (16 - log_scale + AOM_QM_BITS));  // quantization
      qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
      const int iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);

      if (tmp32) {
        eob = i;
#if SKIP_EOB_FACTOR_ADJUST
        if (first == -1) first = i;
#endif  // SKIP_EOB_FACTOR_ADJUST
      }
    }
  }
#if SKIP_EOB_FACTOR_ADJUST
  if (eob >= 0 && first == eob) {
    const int rc = scan[eob];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const int coeff = coeff_ptr[rc] * wt;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
          coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        eob = -1;
      }
    }
  }
#endif  // SKIP_EOB_FACTOR_ADJUST
  *eob_ptr = eob + 1;
}